

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

char * archive_acl_to_text_l
                 (archive_acl *acl,ssize_t *text_len,wchar_t flags,archive_string_conv *sc)

{
  wchar_t wVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  char cVar6;
  uint uVar7;
  archive_acl_entry *paVar8;
  wchar_t want_type;
  char *pcVar9;
  int iVar10;
  char *p;
  undefined4 local_5c;
  archive_string_conv *local_58;
  size_t *local_50;
  size_t local_48;
  char *name;
  size_t len;
  
  if ((acl->acl_types & 0x3c00U) == 0) {
    want_type = flags & 0x300U;
    if ((flags & 0x300U) == L'\0') {
      want_type = L'̀';
    }
  }
  else {
    want_type = L'㰀';
    if ((acl->acl_types & 0x300U) != 0) {
      want_type = L'\0';
    }
  }
  if (want_type != L'\0') {
    if (want_type == L'̀') {
      flags = flags | 2;
    }
    local_58 = sc;
    local_48 = archive_acl_text_len(acl,want_type,flags,L'\0',(archive *)0x0,sc);
    if (local_48 == 0) {
      return (char *)0x0;
    }
    local_5c = 0x2c;
    if ((flags & 8U) == 0) {
      local_5c = 10;
    }
    pcVar2 = (char *)malloc(local_48);
    p = pcVar2;
    if (pcVar2 == (char *)0x0) {
      piVar5 = __errno_location();
      if (*piVar5 != 0xc) {
        return (char *)0x0;
      }
      pcVar2 = "No memory";
    }
    else {
      iVar10 = 0;
      local_50 = (size_t *)text_len;
      if (((uint)want_type >> 8 & 1) != 0) {
        uVar7 = acl->mode;
        builtin_strncpy(pcVar2,"user",5);
        sVar3 = strlen(pcVar2);
        pcVar2[sVar3] = ':';
        pcVar2[sVar3 + 1] = ':';
        cVar6 = 'r';
        if ((uVar7 >> 8 & 1) == 0) {
          cVar6 = '-';
        }
        pcVar2[sVar3 + 2] = cVar6;
        cVar6 = 'w';
        if (-1 < (char)uVar7) {
          cVar6 = '-';
        }
        pcVar2[sVar3 + 3] = cVar6;
        cVar6 = 'x';
        if ((uVar7 & 0x40) == 0) {
          cVar6 = '-';
        }
        pcVar2[sVar3 + 4] = cVar6;
        p = pcVar2 + sVar3 + 6;
        pcVar2[sVar3 + 5] = (char)local_5c;
        pcVar9 = pcVar2 + sVar3 + 6;
        pcVar9[0] = 'g';
        pcVar9[1] = 'r';
        pcVar9[2] = 'o';
        pcVar9[3] = 'u';
        (pcVar2 + sVar3 + 10)[0] = 'p';
        (pcVar2 + sVar3 + 10)[1] = '\0';
        sVar4 = strlen(p);
        pcVar2[sVar4 + sVar3 + 6] = ':';
        pcVar2[sVar4 + sVar3 + 7] = ':';
        cVar6 = 'r';
        if ((uVar7 & 0x20) == 0) {
          cVar6 = '-';
        }
        pcVar2[sVar4 + sVar3 + 8] = cVar6;
        cVar6 = 'w';
        if ((uVar7 & 0x10) == 0) {
          cVar6 = '-';
        }
        pcVar2[sVar4 + sVar3 + 9] = cVar6;
        cVar6 = 'x';
        if ((uVar7 & 8) == 0) {
          cVar6 = '-';
        }
        pcVar2[sVar4 + sVar3 + 10] = cVar6;
        p = pcVar2 + sVar4 + 0xc + sVar3;
        p[-1] = (char)local_5c;
        append_entry(&p,(char *)0x0,L'Ā',L'✖',flags,(char *)0x0,acl->mode & 7,L'\xffffffff');
        iVar10 = 3;
      }
      for (paVar8 = acl->acl_head; paVar8 != (archive_acl_entry *)0x0; paVar8 = paVar8->next) {
        wVar1 = paVar8->type;
        if (((wVar1 & want_type) != 0) &&
           (((wVar1 != L'Ā' || (uVar7 = paVar8->tag + L'\xffffd8ee', 4 < uVar7)) ||
            ((0x15U >> (uVar7 & 0x1f) & 1) == 0)))) {
          pcVar9 = (char *)0x0;
          if (wVar1 == L'Ȁ') {
            pcVar9 = "default:";
          }
          if ((flags & 2U) == 0) {
            pcVar9 = (char *)0x0;
          }
          wVar1 = archive_mstring_get_mbs_l((archive *)0x0,&paVar8->name,&name,&len,local_58);
          if (wVar1 != L'\0') {
            free(pcVar2);
            return (char *)0x0;
          }
          if (0 < iVar10) {
            *p = (char)local_5c;
            p = p + 1;
          }
          wVar1 = L'\xffffffff';
          if ((flags & 1U) != 0 || name == (char *)0x0) {
            wVar1 = paVar8->id;
          }
          append_entry(&p,pcVar9,paVar8->type,paVar8->tag,flags,name,paVar8->permset,wVar1);
          iVar10 = iVar10 + 1;
        }
      }
      *p = '\0';
      p = p + 1;
      len = strlen(pcVar2);
      if ((long)len < (long)local_48) {
        if (local_50 != (size_t *)0x0) {
          *local_50 = len;
          return pcVar2;
        }
        return pcVar2;
      }
      pcVar2 = "Buffer overrun";
    }
    __archive_errx(1,pcVar2);
  }
  return (char *)0x0;
}

Assistant:

char *
archive_acl_to_text_l(struct archive_acl *acl, ssize_t *text_len, int flags,
    struct archive_string_conv *sc)
{
	int count;
	ssize_t length;
	size_t len;
	const char *name;
	const char *prefix;
	char separator;
	struct archive_acl_entry *ap;
	int id, r, want_type;
	char *p, *s;

	want_type = archive_acl_text_want_type(acl, flags);

	/* Both NFSv4 and POSIX.1 types found */
	if (want_type == 0)
		return (NULL);

	if (want_type == ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)
		flags |= ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT;

	length = archive_acl_text_len(acl, want_type, flags, 0, NULL, sc);

	if (length == 0)
		return (NULL);

	if (flags & ARCHIVE_ENTRY_ACL_STYLE_SEPARATOR_COMMA)
		separator = ',';
	else
		separator = '\n';

	/* Now, allocate the string and actually populate it. */
	p = s = (char *)malloc(length * sizeof(char));
	if (p == NULL) {
		if (errno == ENOMEM)
			__archive_errx(1, "No memory");
		return (NULL);
	}
	count = 0;

	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_USER_OBJ, flags, NULL,
		    acl->mode & 0700, -1);
		*p++ = separator;
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_GROUP_OBJ, flags, NULL,
		    acl->mode & 0070, -1);
		*p++ = separator;
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_OTHER, flags, NULL,
		    acl->mode & 0007, -1);
		count += 3;
	}

	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		if (ap->type == ARCHIVE_ENTRY_ACL_TYPE_DEFAULT &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) != 0)
			prefix = "default:";
		else
			prefix = NULL;
		r = archive_mstring_get_mbs_l(
		    NULL, &ap->name, &name, &len, sc);
		if (r != 0) {
			free(s);
			return (NULL);
		}
		if (count > 0)
			*p++ = separator;
		if (name == NULL ||
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)) {
			id = ap->id;
		} else {
			id = -1;
		}
		append_entry(&p, prefix, ap->type, ap->tag, flags, name,
		    ap->permset, id);
		count++;
	}

	/* Add terminating character */
	*p++ = '\0';

	len = strlen(s);

	if ((ssize_t)len > (length - 1))
		__archive_errx(1, "Buffer overrun");

	if (text_len != NULL)
		*text_len = len;

	return (s);
}